

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::EnterFrame(SQVM *this,SQInteger newbase,SQInteger newtop,bool tailcall)

{
  long lVar1;
  SQUnsignedInteger SVar2;
  byte in_CL;
  long in_RDX;
  SQInteger in_RSI;
  SQVM *in_RDI;
  SQVM *unaff_retaddr;
  SQObjectPtrVec *fill;
  sqvector<SQObjectPtr> *this_00;
  sqvector<SQObjectPtr> local_38;
  long local_20;
  SQInteger local_18;
  
  local_38._allocated._7_1_ = in_CL & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (local_38._allocated._7_1_ == 0) {
    if (in_RDI->_callsstacksize == in_RDI->_alloccallsstacksize) {
      GrowCallStack(unaff_retaddr);
    }
    lVar1 = in_RDI->_callsstacksize;
    in_RDI->_callsstacksize = lVar1 + 1;
    in_RDI->ci = in_RDI->_callsstack + lVar1;
    in_RDI->ci->_prevstkbase = (int)local_18 - (int)in_RDI->_stackbase;
    in_RDI->ci->_prevtop = (int)in_RDI->_top - (int)in_RDI->_stackbase;
    in_RDI->ci->_etraps = 0;
    in_RDI->ci->_ncalls = 1;
    in_RDI->ci->_generator = (SQGenerator *)0x0;
    in_RDI->ci->_root = 0;
  }
  else {
    in_RDI->ci->_ncalls = in_RDI->ci->_ncalls + 1;
  }
  in_RDI->_stackbase = local_18;
  in_RDI->_top = local_20;
  lVar1 = local_20 + 0xf;
  SVar2 = sqvector<SQObjectPtr>::size(&in_RDI->_stack);
  if ((long)SVar2 < lVar1) {
    if (in_RDI->_nmetamethodscall != 0) {
      Raise_Error(in_RDI,"stack overflow, cannot resize stack while in a metamethod");
      return false;
    }
    fill = &in_RDI->_stack;
    SVar2 = local_20 + 0x3c;
    this_00 = &local_38;
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_00);
    sqvector<SQObjectPtr>::resize(this_00,SVar2,(SQObjectPtr *)fill);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)fill);
    RelocateOuters(in_RDI);
  }
  return true;
}

Assistant:

bool SQVM::EnterFrame(SQInteger newbase, SQInteger newtop, bool tailcall)
{
    if( !tailcall ) {
        if( _callsstacksize == _alloccallsstacksize ) {
            GrowCallStack();
        }
        ci = &_callsstack[_callsstacksize++];
        ci->_prevstkbase = (SQInt32)(newbase - _stackbase);
        ci->_prevtop = (SQInt32)(_top - _stackbase);
        ci->_etraps = 0;
        ci->_ncalls = 1;
        ci->_generator = NULL;
        ci->_root = SQFalse;
    }
    else {
        ci->_ncalls++;
    }

    _stackbase = newbase;
    _top = newtop;
    if(newtop + MIN_STACK_OVERHEAD > (SQInteger)_stack.size()) {
        if(_nmetamethodscall) {
            Raise_Error(_SC("stack overflow, cannot resize stack while in a metamethod"));
            return false;
        }
        _stack.resize(newtop + (MIN_STACK_OVERHEAD << 2));
        RelocateOuters();
    }
    return true;
}